

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::MakeSegsFromSides(FNodeBuilder *this)

{
  DWORD DVar1;
  FPrivSeg *pFVar2;
  uint local_14;
  int j;
  int i;
  FNodeBuilder *this_local;
  
  if (this->Level->NumLines == 0) {
    I_Error("Map is empty.\n");
  }
  for (local_14 = 0; (int)local_14 < this->Level->NumLines; local_14 = local_14 + 1) {
    if (this->Level->Lines[(int)local_14].sidedef[0] == (side_t *)0x0) {
      Printf("Linedef %d does not have a front side.\n",(ulong)local_14);
    }
    else {
      CreateSeg(this,local_14,0);
    }
    if ((this->Level->Lines[(int)local_14].sidedef[1] != (side_t *)0x0) &&
       (DVar1 = CreateSeg(this,local_14,1),
       this->Level->Lines[(int)local_14].sidedef[0] != (side_t *)0x0)) {
      pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(long)(int)(DVar1 - 1));
      pFVar2->partner = DVar1;
      pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(long)(int)DVar1);
      pFVar2->partner = DVar1 - 1;
    }
  }
  return;
}

Assistant:

void FNodeBuilder::MakeSegsFromSides ()
{
	int i, j;

	if (Level.NumLines == 0)
	{
		I_Error ("Map is empty.\n");
	}

	for (i = 0; i < Level.NumLines; ++i)
	{
		if (Level.Lines[i].sidedef[0] != NULL)
		{
			CreateSeg (i, 0);
		}
		else
		{
			Printf ("Linedef %d does not have a front side.\n", i);
		}

		if (Level.Lines[i].sidedef[1] != NULL)
		{
			j = CreateSeg (i, 1);
			if (Level.Lines[i].sidedef[0] != NULL)
			{
				Segs[j-1].partner = j;
				Segs[j].partner = j-1;
			}
		}
	}
}